

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Aig_NodeCompareRefsIncrease(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *(uint *)&(*pp1)->field_0x18 >> 6;
  uVar3 = *(uint *)&(*pp2)->field_0x18 >> 6;
  if (uVar3 <= uVar4) {
    if (uVar4 != uVar3) {
      return 1;
    }
    iVar1 = (*pp2)->Id;
    iVar2 = (*pp1)->Id;
    if (iVar1 <= iVar2) {
      return (int)(iVar2 != iVar1);
    }
  }
  return -1;
}

Assistant:

int Aig_NodeCompareRefsIncrease( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjRefs(*pp1) - Aig_ObjRefs(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = Aig_ObjId(*pp1) - Aig_ObjId(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}